

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O1

void SetRemap(FRemapTable *table,int i,float r,float g,float b)

{
  BYTE BVar1;
  uint b_00;
  int r_00;
  int g_00;
  
  r_00 = (int)(r * 255.0);
  if (0xfe < (int)(r * 255.0)) {
    r_00 = 0xff;
  }
  if (r_00 < 1) {
    r_00 = 0;
  }
  g_00 = (int)(g * 255.0);
  if (0xfe < g_00) {
    g_00 = 0xff;
  }
  if (g_00 < 1) {
    g_00 = 0;
  }
  b_00 = 0xff;
  if ((int)(b * 255.0) < 0xff) {
    b_00 = (int)(b * 255.0);
  }
  if ((int)b_00 < 1) {
    b_00 = 0;
  }
  BVar1 = FColorMatcher::Pick(&ColorMatcher,r_00,g_00,b_00);
  table->Remap[i] = BVar1;
  table->Palette[i].field_0 =
       (anon_union_4_2_12391d7c_for_PalEntry_0)(g_00 << 8 | r_00 << 0x10 | b_00 | 0xff000000);
  return;
}

Assistant:

static void SetRemap(FRemapTable *table, int i, float r, float g, float b)
{
	int ir = clamp (int(r * 255.f), 0, 255);
	int ig = clamp (int(g * 255.f), 0, 255);
	int ib = clamp (int(b * 255.f), 0, 255);
	table->Remap[i] = ColorMatcher.Pick (ir, ig, ib);
	table->Palette[i] = PalEntry(255, ir, ig, ib);
}